

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PEnum::PEnum(PEnum *this,FName *name,DObject *outer)

{
  FName local_14;
  
  PNamedType::PNamedType(&this->super_PNamedType,&local_14,outer);
  (this->super_PNamedType).super_PCompoundType.super_PType.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007c7ef0;
  this->ValueType = (PType *)0x0;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap(&this->Values);
  return;
}

Assistant:

PEnum::PEnum(FName name, DObject *outer)
: PNamedType(name, outer), ValueType(NULL)
{
}